

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm.c
# Opt level: O2

int nvrm_get_chipset(gpu_object *obj)

{
  gpu_object *dev;
  nvrm_device *pnVar1;
  
  while( true ) {
    dev = nvrm_get_device(obj);
    if ((dev != (gpu_object *)0x0) && (dev->class_data != (void *)0x0)) break;
    if (chipset == 0) {
      fprintf(_stdout,
              "ERROR: Can\'t detect chipset, you need to use -m option or regenerate trace with newer mmt (> Sep 7 2014)%s\n"
              ,"");
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
      demmt_abort();
    }
    nvrm_device_set_chipset(dev,chipset);
  }
  pnVar1 = nvrm_dev(dev);
  return pnVar1->chipset;
}

Assistant:

int nvrm_get_chipset(struct gpu_object *obj)
{
	struct gpu_object *dev = nvrm_get_device(obj);

	if (dev && dev->class_data)
		return nvrm_dev(dev)->chipset;

	if (chipset) {
		nvrm_device_set_chipset(dev, chipset);
		return nvrm_get_chipset(obj);
	}

	mmt_error("Can't detect chipset, you need to use -m option or regenerate trace with newer mmt (> Sep 7 2014)%s\n", "");
	demmt_abort();
}